

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

char * __thiscall
google::protobuf::MethodDescriptorProto::_InternalParse
          (MethodDescriptorProto *this,char *ptr,ParseContext *ctx)

{
  ArenaStringPtr *this_00;
  ArenaStringPtr *this_01;
  byte bVar1;
  byte bVar2;
  MethodOptions *pMVar3;
  ArenaStringPtr *pAVar4;
  char cVar5;
  uint32 uVar6;
  uint tag;
  Arena *pAVar7;
  ArenaStringPtr *this_02;
  uint uVar8;
  pair<const_char_*,_unsigned_int> pVar9;
  pair<const_char_*,_unsigned_long> pVar10;
  pair<const_char_*,_bool> pVar11;
  
  this_02 = &this->output_type_;
  this_00 = &this->input_type_;
  this_01 = &this->name_;
  uVar8 = 0;
  do {
    if (ptr < (ctx->super_EpsCopyInputStream).limit_end_) {
      pVar11._8_8_ = 0;
      pVar11.first = ptr;
    }
    else {
      pVar11._8_8_ = 1;
      pVar11.first = ptr;
      if ((long)ptr - (long)(ctx->super_EpsCopyInputStream).buffer_end_ !=
          (long)(ctx->super_EpsCopyInputStream).limit_) {
        pVar11 = internal::EpsCopyInputStream::DoneFallback
                           (&ctx->super_EpsCopyInputStream,ptr,ctx->group_depth_);
      }
    }
    ptr = pVar11.first;
    if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
    goto LAB_003467c0;
    bVar1 = *ptr;
    pVar9.second._0_1_ = bVar1;
    pVar9.first = (char *)((byte *)ptr + 1);
    pVar9._9_7_ = 0;
    if ((char)bVar1 < '\0') {
      bVar2 = ((byte *)ptr)[1];
      uVar6 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
      if ((char)bVar2 < '\0') {
        pVar9 = internal::ReadTagFallback(ptr,uVar6);
      }
      else {
        pVar9.second = uVar6;
        pVar9.first = (char *)((byte *)ptr + 2);
        pVar9._12_4_ = 0;
      }
    }
    ptr = pVar9.first;
    if ((byte *)ptr == (byte *)0x0) {
      cVar5 = '\x04';
    }
    else {
      tag = pVar9.second;
      cVar5 = (char)pVar9.second;
      switch((uint)(pVar9._8_8_ >> 3) & 0x1fffffff) {
      case 1:
        if (cVar5 == '\n') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
          pAVar7 = (Arena *)(this->_internal_metadata_).
                            super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                            .ptr_;
          if (((ulong)pAVar7 & 1) != 0) {
            pAVar7 = *(Arena **)(((ulong)pAVar7 & 0xfffffffffffffffe) + 0x18);
          }
          pAVar4 = this_01;
          if (this_01->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
            internal::ArenaStringPtr::CreateInstance
                      (this_01,pAVar7,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
          }
LAB_0034665a:
          ptr = internal::InlineGreedyStringParser(pAVar4->ptr_,ptr,ctx);
LAB_00346668:
          cVar5 = ((byte *)ptr == (byte *)0x0) * '\x02' + '\x02';
          goto LAB_00346742;
        }
        break;
      case 2:
        if (cVar5 == '\x12') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
          pAVar7 = (Arena *)(this->_internal_metadata_).
                            super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                            .ptr_;
          if (((ulong)pAVar7 & 1) != 0) {
            pAVar7 = *(Arena **)(((ulong)pAVar7 & 0xfffffffffffffffe) + 0x18);
          }
          pAVar4 = this_00;
          if (this_00->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
            internal::ArenaStringPtr::CreateInstance
                      (this_00,pAVar7,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
          }
          goto LAB_0034665a;
        }
        break;
      case 3:
        if (cVar5 != '\x1a') break;
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
        pAVar7 = (Arena *)(this->_internal_metadata_).
                          super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                          .ptr_;
        if (((ulong)pAVar7 & 1) != 0) {
          pAVar7 = *(Arena **)(((ulong)pAVar7 & 0xfffffffffffffffe) + 0x18);
        }
        if (this_02->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
          internal::ArenaStringPtr::CreateInstance
                    (this_02,pAVar7,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        }
        ptr = internal::InlineGreedyStringParser(this_02->ptr_,ptr,ctx);
        goto LAB_003466eb;
      case 4:
        if (cVar5 == '\"') {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
          if (this->options_ == (MethodOptions *)0x0) {
            pAVar7 = (Arena *)(this->_internal_metadata_).
                              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                              .ptr_;
            if (((ulong)pAVar7 & 1) != 0) {
              pAVar7 = *(Arena **)(((ulong)pAVar7 & 0xfffffffffffffffe) + 0x18);
            }
            pMVar3 = Arena::CreateMaybeMessage<google::protobuf::MethodOptions>(pAVar7);
            this->options_ = pMVar3;
          }
          ptr = internal::ParseContext::ParseMessage<google::protobuf::MethodOptions>
                          (ctx,this->options_,ptr);
          goto LAB_00346668;
        }
        break;
      case 5:
        if (cVar5 == '(') {
          bVar1 = *ptr;
          pVar10.second = (long)(char)bVar1;
          pVar10.first = (char *)((byte *)ptr + 1);
          if ((long)(char)bVar1 < 0) {
            bVar2 = ((byte *)ptr)[1];
            uVar6 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
            if ((char)bVar2 < '\0') {
              pVar10 = internal::VarintParseSlow64(ptr,uVar6);
            }
            else {
              pVar10.second._0_4_ = uVar6;
              pVar10.first = (char *)((byte *)ptr + 2);
              pVar10.second._4_4_ = 0;
            }
          }
          uVar8 = uVar8 | 0x10;
          this->client_streaming_ = pVar10.second != 0;
LAB_00346730:
          ptr = pVar10.first;
          cVar5 = ((byte *)ptr == (byte *)0x0) * '\x02' + '\x02';
          goto LAB_00346742;
        }
        break;
      case 6:
        if (cVar5 == '0') {
          bVar1 = *ptr;
          pVar10.second = (long)(char)bVar1;
          pVar10.first = (char *)((byte *)ptr + 1);
          if ((long)(char)bVar1 < 0) {
            bVar2 = ((byte *)ptr)[1];
            uVar6 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
            if ((char)bVar2 < '\0') {
              pVar10 = internal::VarintParseSlow64(ptr,uVar6);
            }
            else {
              pVar10.second._0_4_ = uVar6;
              pVar10.first = (char *)((byte *)ptr + 2);
              pVar10.second._4_4_ = 0;
            }
          }
          uVar8 = uVar8 | 0x20;
          this->server_streaming_ = pVar10.second != 0;
          goto LAB_00346730;
        }
      }
      if (tag == 0 || (tag & 7) == 4) {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = tag - 1;
        cVar5 = '\a';
      }
      else {
        ptr = internal::UnknownFieldParse(tag,&this->_internal_metadata_,ptr,ctx);
LAB_003466eb:
        cVar5 = ((byte *)ptr == (byte *)0x0) * '\x02' + '\x02';
      }
    }
LAB_00346742:
  } while (cVar5 == '\x02');
  if (cVar5 == '\x04') {
    ptr = (char *)0x0;
  }
LAB_003467c0:
  (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar8;
  return (char *)(byte *)ptr;
}

Assistant:

const char* MethodDescriptorProto::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional string name = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_name(), ptr, ctx, "google.protobuf.MethodDescriptorProto.name");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string input_type = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_input_type(), ptr, ctx, "google.protobuf.MethodDescriptorProto.input_type");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional string output_type = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_output_type(), ptr, ctx, "google.protobuf.MethodDescriptorProto.output_type");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional .google.protobuf.MethodOptions options = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 34)) {
          ptr = ctx->ParseMessage(_internal_mutable_options(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool client_streaming = 5 [default = false];
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 40)) {
          _Internal::set_has_client_streaming(&has_bits);
          client_streaming_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool server_streaming = 6 [default = false];
      case 6:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 48)) {
          _Internal::set_has_server_streaming(&has_bits);
          server_streaming_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}